

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_3fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  ON_2fPoint *pOVar1;
  ON_MeshFace *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  ON_TextureCoordinates *pOVar7;
  ON_2fPoint *pOVar8;
  ON_MeshFace *pOVar9;
  ON_3fVector *pOVar10;
  ON_MeshFace *pOVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  bool bVar25;
  int iVar26;
  double *m;
  double *m_00;
  ON_Mesh *mesh_00;
  ON_RenderMeshInfo *pRenderMeshInfo;
  ON_3fPoint *pOVar27;
  long lVar28;
  ulong uVar29;
  int v;
  ON_Xform *pOVar30;
  CMeshClosestPointMapper *pCVar31;
  ON_Xform *pOVar32;
  ulong newcap;
  int *piVar33;
  int i_local;
  long lVar34;
  long lVar35;
  ON_3dPoint *p;
  byte bVar36;
  ulong uVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  ON_3fVector OVar43;
  ON_3dPoint *in_stack_fffffffffffff310;
  int *local_cd8;
  ON_3dPointArray tcSum;
  ON_3fVector *local_ca8;
  undefined1 local_ca0 [16];
  ON_3dVector local_c90;
  ON_3dVector local_c78;
  ON_2fPointArray temp_tcs;
  ON_3dPointArray matchedTcSum;
  ON_SimpleArray<int> tcTerms;
  void *local_c10;
  ON_3dPoint local_c08;
  ON_SimpleArray<int> matchedTcTerms;
  ON_3dPoint t [4];
  ON_3dVector local_b78;
  double dStack_b60;
  ON_3dPoint vtx [4];
  ON_3dVector vtN012;
  ON_Xform matP;
  ON_3dPoint tc;
  ON_3dVector vtN230;
  ON_Xform matN;
  ON_Xform N_xform;
  ON_Xform P_xform;
  CMeshClosestPointMapper meshMapper;
  
  bVar36 = 0;
  if ((Tside != (ON_SimpleArray<int> *)0x0) && (-1 < Tside->m_capacity)) {
    Tside->m_count = 0;
  }
  uVar5 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  newcap = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    return false;
  }
  if (bLazy) {
    uVar6 = (mesh->m_TC).m_count;
    uVar29 = 0;
    uVar37 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar37 = uVar29;
    }
    for (lVar34 = -0xa0; lVar34 + uVar37 * 0xb8 != -0xa0; lVar34 = lVar34 + -0xb8) {
      pOVar7 = (mesh->m_TC).m_a;
      if ((uVar5 == *(uint *)((long)&(pOVar7->m_T).m_count + uVar29)) &&
         (bVar25 = HasMatchingTextureCoordinates
                             (this,(ON_MappingTag *)
                                   ((pOVar7->m_tag).m_mapping_id.Data4 + (uVar29 - 8)),mesh_xform),
         bVar25)) {
        ON_SimpleArray<ON_3fPoint>::operator=
                  (T,(ON_SimpleArray<ON_3fPoint> *)((long)(mesh->m_TC).m_a - lVar34));
        return true;
      }
      uVar29 = uVar29 + 0xb8;
    }
    bVar25 = HasMatchingTextureCoordinates(this,mesh,mesh_xform);
    if (bVar25) {
      ON_SimpleArray<ON_3fPoint>::Reserve(T,newcap);
      if ((int)uVar5 <= T->m_capacity) {
        T->m_count = uVar5;
      }
      pOVar8 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      pOVar27 = T->m_a;
      for (lVar34 = 0; uVar5 != (uint)lVar34; lVar34 = lVar34 + 1) {
        pOVar1 = pOVar8 + lVar34;
        fVar12 = pOVar1->y;
        pOVar27->x = pOVar1->x;
        pOVar27->y = fVar12;
        pOVar27->z = 0.0;
        pOVar27 = pOVar27 + 1;
      }
      return true;
    }
  }
  if (this->m_type == srfp_mapping) {
    ON_SimpleArray<ON_3fPoint>::Reserve(T,newcap);
    if ((int)uVar5 <= T->m_capacity) {
      T->m_count = uVar5;
    }
    ON_SimpleArray<ON_3fPoint>::Zero(T);
    bVar25 = GetSPTCHelper(mesh,this,&T->m_a->x,3);
    return bVar25;
  }
  ON_3dVector::ON_3dVector(&local_b78,0.0,0.0,0.0);
  pOVar27 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  bVar25 = ON_Mesh::HasVertexNormals(mesh);
  if (bVar25) {
    local_ca8 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
  }
  else {
    local_ca8 = (ON_3fVector *)0x0;
  }
  ON_SimpleArray<ON_3fPoint>::Reserve(T,newcap);
  if ((int)uVar5 <= T->m_capacity) {
    T->m_count = uVar5;
  }
  if (Tside == (ON_SimpleArray<int> *)0x0) {
    local_cd8 = (int *)0x0;
  }
  else {
    ON_SimpleArray<int>::Reserve(Tside,newcap);
    if ((int)uVar5 <= Tside->m_capacity) {
      Tside->m_count = uVar5;
    }
    local_cd8 = Tside->m_a;
    memset(local_cd8,0,newcap * 4);
  }
  lVar34 = 0x10;
  pOVar30 = &ON_Xform::IdentityTransformation;
  pOVar32 = &P_xform;
  for (lVar28 = lVar34; lVar28 != 0; lVar28 = lVar28 + -1) {
    pOVar32->m_xform[0][0] = pOVar30->m_xform[0][0];
    pOVar30 = (ON_Xform *)((long)pOVar30 + ((ulong)bVar36 * -2 + 1) * 8);
    pOVar32 = (ON_Xform *)((long)pOVar32 + ((ulong)bVar36 * -2 + 1) * 8);
  }
  pOVar30 = &ON_Xform::IdentityTransformation;
  pOVar32 = &N_xform;
  for (; lVar34 != 0; lVar34 = lVar34 + -1) {
    pOVar32->m_xform[0][0] = pOVar30->m_xform[0][0];
    pOVar30 = (ON_Xform *)((long)pOVar30 + ((ulong)bVar36 * -2 + 1) * 8);
    pOVar32 = (ON_Xform *)((long)pOVar32 + ((ulong)bVar36 * -2 + 1) * 8);
  }
  if (((mesh_xform != (ON_Xform *)0x0) && (bVar25 = ON_Xform::IsZero(mesh_xform), !bVar25)) &&
     (bVar25 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar25)) {
    dVar38 = ON_Xform::GetMappingXforms(mesh_xform,&P_xform,&N_xform);
    if ((dVar38 != 0.0) || (NAN(dVar38))) {
      m = ON_Xform::operator[](&P_xform,0);
      m_00 = ON_Xform::operator[](&N_xform,0);
      goto LAB_004f4e67;
    }
  }
  m = (double *)0x0;
  m_00 = (double *)0x0;
LAB_004f4e67:
  if (((this->m_projection == clspt_projection) &&
      ((this->m_type == brep_mapping_primitive || (this->m_type == mesh_mapping_primitive)))) &&
     ((this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    ON_2fPointArray::ON_2fPointArray(&temp_tcs);
    lVar34 = 0x10;
    pOVar30 = &this->m_Pxyz;
    pOVar32 = &matP;
    for (lVar28 = lVar34; lVar28 != 0; lVar28 = lVar28 + -1) {
      pOVar32->m_xform[0][0] = pOVar30->m_xform[0][0];
      pOVar30 = (ON_Xform *)((long)pOVar30 + (ulong)bVar36 * -0x10 + 8);
      pOVar32 = (ON_Xform *)((long)pOVar32 + ((ulong)bVar36 * -2 + 1) * 8);
    }
    pOVar30 = &this->m_Nxyz;
    pOVar32 = &matN;
    for (; lVar34 != 0; lVar34 = lVar34 + -1) {
      pOVar32->m_xform[0][0] = pOVar30->m_xform[0][0];
      pOVar30 = (ON_Xform *)((long)pOVar30 + (ulong)bVar36 * -0x10 + 8);
      pOVar32 = (ON_Xform *)((long)pOVar32 + ((ulong)bVar36 * -2 + 1) * 8);
    }
    if (m != (double *)0x0) {
      ON_Xform::ON_Xform((ON_Xform *)vtx,m);
      ON_Xform::operator*((ON_Xform *)&meshMapper,&matP,(ON_Xform *)vtx);
      pCVar31 = &meshMapper;
      pOVar30 = &matP;
      for (lVar34 = 0x10; lVar34 != 0; lVar34 = lVar34 + -1) {
        pOVar30->m_xform[0][0] =
             (double)(pCVar31->super_IClosestPointMapper)._vptr_IClosestPointMapper;
        pCVar31 = (CMeshClosestPointMapper *)((long)pCVar31 + (ulong)bVar36 * -0x10 + 8);
        pOVar30 = (ON_Xform *)((long)pOVar30 + ((ulong)bVar36 * -2 + 1) * 8);
      }
    }
    if (m_00 != (double *)0x0) {
      ON_Xform::ON_Xform((ON_Xform *)vtx,m_00);
      ON_Xform::operator*((ON_Xform *)&meshMapper,&matN,(ON_Xform *)vtx);
      pCVar31 = &meshMapper;
      pOVar30 = &matN;
      for (lVar34 = 0x10; lVar34 != 0; lVar34 = lVar34 + -1) {
        pOVar30->m_xform[0][0] =
             (double)(pCVar31->super_IClosestPointMapper)._vptr_IClosestPointMapper;
        pCVar31 = (CMeshClosestPointMapper *)((long)pCVar31 + (ulong)bVar36 * -0x10 + 8);
        pOVar30 = (ON_Xform *)((long)pOVar30 + ((ulong)bVar36 * -2 + 1) * 8);
      }
    }
    if ((this->m_type == mesh_mapping_primitive) &&
       (mesh_00 = CustomMappingMeshPrimitive(this), mesh_00 != (ON_Mesh *)0x0)) {
      pRenderMeshInfo = ON_Mesh::GetRenderMeshInfo(mesh);
      CMeshClosestPointMapper::CMeshClosestPointMapper
                (&meshMapper,mesh_00,&mesh_00->m_T,pRenderMeshInfo,&matP);
      iVar26 = (*meshMapper.super_IClosestPointMapper._vptr_IClosestPointMapper[2])();
      if ((char)iVar26 == '\0') {
        CMeshClosestPointMapper::~CMeshClosestPointMapper(&meshMapper);
      }
      else {
        iVar26 = ON_Mesh::VertexCount(mesh);
        ON_3dPointArray::ON_3dPointArray(&tcSum,iVar26);
        iVar26 = ON_Mesh::VertexCount(mesh);
        if (iVar26 <= tcSum.super_ON_SimpleArray<ON_3dPoint>.m_capacity && -1 < iVar26) {
          tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count = iVar26;
        }
        if (0 < tcSum.super_ON_SimpleArray<ON_3dPoint>.m_capacity &&
            tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a != (ON_3dPoint *)0x0) {
          memset(tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a,0,
                 (ulong)(uint)tcSum.super_ON_SimpleArray<ON_3dPoint>.m_capacity * 0x18);
        }
        ON_SimpleArray<int>::ON_SimpleArray
                  (&tcTerms,(long)tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count);
        if (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count <= tcTerms.m_capacity &&
            -1 < tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count) {
          tcTerms.m_count = tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count;
        }
        if (0 < tcTerms.m_capacity && tcTerms.m_a != (int *)0x0) {
          memset(tcTerms.m_a,0,(ulong)(uint)tcTerms.m_capacity << 2);
        }
        iVar26 = ON_Mesh::VertexCount(mesh);
        ON_3dPointArray::ON_3dPointArray(&matchedTcSum,iVar26);
        iVar26 = ON_Mesh::VertexCount(mesh);
        if (iVar26 <= matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_capacity && -1 < iVar26) {
          matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_count = iVar26;
        }
        if (0 < matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_capacity &&
            matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_a != (ON_3dPoint *)0x0) {
          memset(matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_a,0,
                 (ulong)(uint)matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_capacity * 0x18);
        }
        ON_SimpleArray<int>::ON_SimpleArray
                  (&matchedTcTerms,(long)matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_count);
        if (matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_count <= matchedTcTerms.m_capacity &&
            -1 < matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_count) {
          matchedTcTerms.m_count = matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_count;
        }
        if (0 < matchedTcTerms.m_capacity && matchedTcTerms.m_a != (int *)0x0) {
          memset(matchedTcTerms.m_a,0,(ulong)(uint)matchedTcTerms.m_capacity << 2);
        }
        ON_SimpleArray<ON_2fPoint>::Reserve
                  (&temp_tcs.super_ON_SimpleArray<ON_2fPoint>,
                   (long)tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count);
        if (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count <=
            temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_capacity &&
            -1 < tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count) {
          temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_count =
               tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count;
        }
        if (0 < temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_capacity &&
            temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a != (ON_2fPoint *)0x0) {
          memset(temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a,0,
                 (ulong)(uint)temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_capacity << 3);
        }
        uVar5 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        local_c10 = (void *)0x0;
        for (lVar34 = 0; lVar34 < (mesh->m_F).m_count; lVar34 = lVar34 + 1) {
          pOVar9 = (mesh->m_F).m_a;
          if (((((uint)pOVar9[lVar34].vi[0] < uVar5) &&
               (this_00 = pOVar9 + lVar34, (uint)this_00->vi[1] < uVar5)) &&
              ((uint)this_00->vi[2] < uVar5)) && ((uint)this_00->vi[3] < uVar5)) {
            bVar25 = ON_Mesh::HasFaceNormals(mesh);
            if (bVar25) {
              pOVar10 = (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a;
              local_ca0._0_8_ = *(_func_int ***)(pOVar10 + lVar34);
              local_ca0._8_4_ = pOVar10[lVar34].z;
            }
            else {
              pOVar11 = (mesh->m_F).m_a;
              pOVar27 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
              OVar43 = ON_3fPoint::operator-
                                 (pOVar27 + pOVar11[lVar34].vi[2],pOVar27 + pOVar11[lVar34].vi[0]);
              t[0].x = OVar43._0_8_;
              t[0].y._0_4_ = OVar43.z;
              pOVar27 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
              vtN012._0_12_ =
                   ON_3fPoint::operator-
                             (pOVar27 + pOVar11[lVar34].vi[3],pOVar27 + pOVar11[lVar34].vi[1]);
              OVar43 = ON_CrossProduct((ON_3fVector *)t,(ON_3fVector *)&vtN012);
              vtx[0].x = OVar43._0_8_;
              vtx[0].y._0_4_ = OVar43.z;
              ON_3fVector::Unitize((ON_3fVector *)vtx);
              local_ca0._0_8_ = vtx[0].x;
              local_ca0._8_4_ = vtx[0].y._0_4_;
            }
            dVar38 = (double)(float)local_ca0._0_8_;
            dVar39 = (double)(float)((ulong)local_ca0._0_8_ >> 0x20);
            dVar40 = (double)(float)local_ca0._8_4_;
            ON_3fVector::Set((ON_3fVector *)local_ca0,
                             (float)(matP.m_xform[0][2] * dVar40 +
                                    matP.m_xform[0][0] * dVar38 + matP.m_xform[0][1] * dVar39),
                             (float)(matP.m_xform[1][2] * dVar40 +
                                    matP.m_xform[1][0] * dVar38 + matP.m_xform[1][1] * dVar39),
                             (float)(dVar40 * matP.m_xform[2][2] +
                                    dVar38 * matP.m_xform[2][0] + dVar39 * matP.m_xform[2][1]));
            ON_3fVector::Unitize((ON_3fVector *)local_ca0);
            ON_3dPoint::ON_3dPoint
                      (vtx,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + this_00->vi[0]);
            ON_3dPoint::ON_3dPoint
                      (vtx + 1,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + this_00->vi[1]);
            ON_3dPoint::ON_3dPoint
                      (vtx + 2,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + this_00->vi[2]);
            ON_3dPoint::ON_3dPoint
                      (vtx + 3,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + this_00->vi[3]);
            dVar24 = matP.m_xform[3][3];
            dVar23 = matP.m_xform[3][2];
            dVar22 = matP.m_xform[3][1];
            dVar21 = matP.m_xform[3][0];
            dVar20 = matP.m_xform[2][3];
            dVar19 = matP.m_xform[2][2];
            dVar18 = matP.m_xform[2][1];
            dVar17 = matP.m_xform[2][0];
            dVar16 = matP.m_xform[1][3];
            dVar15 = matP.m_xform[1][2];
            dVar14 = matP.m_xform[1][1];
            dVar13 = matP.m_xform[1][0];
            dVar41 = matP.m_xform[0][3];
            dVar40 = matP.m_xform[0][2];
            dVar39 = matP.m_xform[0][1];
            dVar38 = matP.m_xform[0][0];
            for (lVar28 = 0x10; lVar28 != 0x70; lVar28 = lVar28 + 0x18) {
              dVar2 = *(double *)((long)&local_b78.z + lVar28);
              dVar3 = *(double *)((long)&dStack_b60 + lVar28);
              dVar4 = *(double *)((long)&vtx[0].x + lVar28);
              dVar42 = dVar23 * dVar4 + dVar21 * dVar2 + dVar22 * dVar3 + dVar24;
              uVar37 = -(ulong)(dVar42 != 0.0);
              dVar42 = (double)(~uVar37 & 0x3ff0000000000000 | (ulong)(1.0 / dVar42) & uVar37);
              *(double *)((long)&local_b78.z + lVar28) =
                   dVar42 * (dVar4 * dVar40 + dVar2 * dVar38 + dVar3 * dVar39 + dVar41);
              *(double *)((long)&dStack_b60 + lVar28) =
                   dVar42 * (dVar4 * dVar15 + dVar2 * dVar13 + dVar3 * dVar14 + dVar16);
              *(double *)((long)&vtx[0].x + lVar28) =
                   (dVar19 * dVar4 + dVar17 * dVar2 + dVar18 * dVar3 + dVar20) * dVar42;
            }
            t[0].z = ON_3dPoint::Origin.z;
            t[0].x = ON_3dPoint::Origin.x;
            t[0].y._0_4_ = SUB84(ON_3dPoint::Origin.y,0);
            t[0].y._4_4_ = (undefined4)((ulong)ON_3dPoint::Origin.y >> 0x20);
            t[1].z = ON_3dPoint::Origin.z;
            t[1].x = ON_3dPoint::Origin.x;
            t[1].y = ON_3dPoint::Origin.y;
            t[2].z = ON_3dPoint::Origin.z;
            t[2].x = ON_3dPoint::Origin.x;
            t[2].y = ON_3dPoint::Origin.y;
            t[3].z = ON_3dPoint::Origin.z;
            t[3].x = ON_3dPoint::Origin.x;
            t[3].y = ON_3dPoint::Origin.y;
            bVar25 = ON_MeshFace::IsQuad(this_00);
            iVar26 = (*meshMapper.super_IClosestPointMapper._vptr_IClosestPointMapper[4])
                               (&meshMapper,(ulong)(bVar25 + 3),vtx,t,local_ca0);
            if ((char)iVar26 == '\0') {
              bVar25 = ON_MeshFace::IsTriangle(this_00);
              if (bVar25) {
                PTCHelper(&meshMapper.super_IClosestPointMapper,(ON_Mesh *)local_ca0,
                          (ON_3fVector *)vtx,(ON_3dPoint *)0x0,1,2,(int)t,in_stack_fffffffffffff310)
                ;
                ON_3dVector::ON_3dVector(&vtN012,t);
                ON_3dPoint::operator+=
                          (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[0],&vtN012);
                ON_3dVector::ON_3dVector(&vtN012,t + 1);
                ON_3dPoint::operator+=
                          (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[1],&vtN012);
                ON_3dVector::ON_3dVector(&vtN012,t + 2);
                ON_3dPoint::operator+=
                          (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[2],&vtN012);
                tcTerms.m_a[this_00->vi[0]] = tcTerms.m_a[this_00->vi[0]] + 1;
                tcTerms.m_a[this_00->vi[1]] = tcTerms.m_a[this_00->vi[1]] + 1;
                iVar26 = this_00->vi[2];
              }
              else {
                ON_3dPoint::operator-(&vtN230,vtx + 1,vtx);
                ON_3dPoint::operator-(&local_c78,vtx + 2,vtx + 1);
                ON_CrossProduct(&vtN012,&vtN230,&local_c78);
                ON_3dPoint::operator-(&local_c78,vtx + 3,vtx + 2);
                ON_3dPoint::operator-(&local_c90,vtx,vtx + 3);
                ON_CrossProduct(&vtN230,&local_c78,&local_c90);
                dVar38 = ON_DotProduct(&vtN012,&vtN230);
                if (dVar38 <= 0.0) {
                  PTCHelper(&meshMapper.super_IClosestPointMapper,(ON_Mesh *)local_ca0,
                            (ON_3fVector *)vtx,(ON_3dPoint *)0x0,1,3,(int)t,
                            in_stack_fffffffffffff310);
                  ON_3dVector::ON_3dVector(&local_c78,t);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[0],&local_c78)
                  ;
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t + 1);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[1],&local_c78)
                  ;
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t + 2);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[3],&local_c78)
                  ;
                  PTCHelper(&meshMapper.super_IClosestPointMapper,(ON_Mesh *)local_ca0,
                            (ON_3fVector *)vtx,(ON_3dPoint *)0x1,2,3,(int)t,
                            in_stack_fffffffffffff310);
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[1],&local_c78)
                  ;
                  ON_3dVector::ON_3dVector(&local_c78,t + 1);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[2],&local_c78)
                  ;
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t + 2);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[3],&local_c78)
                  ;
                }
                else {
                  PTCHelper(&meshMapper.super_IClosestPointMapper,(ON_Mesh *)local_ca0,
                            (ON_3fVector *)vtx,(ON_3dPoint *)0x0,1,2,(int)t,
                            in_stack_fffffffffffff310);
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[0],&local_c78)
                  ;
                  ON_3dVector::ON_3dVector(&local_c78,t + 1);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[1],&local_c78)
                  ;
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t + 2);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[2],&local_c78)
                  ;
                  PTCHelper(&meshMapper.super_IClosestPointMapper,(ON_Mesh *)local_ca0,
                            (ON_3fVector *)vtx,(ON_3dPoint *)0x2,3,0,(int)t,
                            in_stack_fffffffffffff310);
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[2],&local_c78)
                  ;
                  ON_3dVector::ON_3dVector(&local_c78,t + 1);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[3],&local_c78)
                  ;
                  ::operator*((ON_3dPoint *)&local_c90,0.5,t + 2);
                  ON_3dVector::ON_3dVector(&local_c78,(ON_3dPoint *)&local_c90);
                  ON_3dPoint::operator+=
                            (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a + this_00->vi[0],&local_c78)
                  ;
                }
                tcTerms.m_a[this_00->vi[0]] = tcTerms.m_a[this_00->vi[0]] + 1;
                tcTerms.m_a[this_00->vi[1]] = tcTerms.m_a[this_00->vi[1]] + 1;
                tcTerms.m_a[this_00->vi[2]] = tcTerms.m_a[this_00->vi[2]] + 1;
                iVar26 = this_00->vi[3];
              }
              tcTerms.m_a[iVar26] = tcTerms.m_a[iVar26] + 1;
            }
            else {
              lVar28 = (long)pOVar9->vi + (long)local_c10;
              p = t;
              for (uVar37 = 0; bVar25 + 3 != uVar37; uVar37 = uVar37 + 1) {
                ON_3dVector::ON_3dVector(&vtN012,p);
                ON_3dPoint::operator+=
                          (tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a +
                           *(int *)(lVar28 + uVar37 * 4),&vtN012);
                tcTerms.m_a[*(int *)(lVar28 + uVar37 * 4)] =
                     tcTerms.m_a[*(int *)(lVar28 + uVar37 * 4)] + 1;
                ON_3dVector::ON_3dVector(&vtN012,p);
                ON_3dPoint::operator+=
                          (matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_a +
                           *(int *)(lVar28 + uVar37 * 4),&vtN012);
                matchedTcTerms.m_a[*(int *)(lVar28 + uVar37 * 4)] =
                     matchedTcTerms.m_a[*(int *)(lVar28 + uVar37 * 4)] + 1;
                p = p + 1;
              }
            }
          }
          else {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
                       ,0x13cb,"","meshTo.m_F[] has invalid faces.");
          }
          local_c10 = (void *)((long)local_c10 + 0x10);
        }
        lVar34 = 0;
        lVar35 = 0;
        for (lVar28 = 0; lVar28 < tcSum.super_ON_SimpleArray<ON_3dPoint>.m_count;
            lVar28 = lVar28 + 1) {
          if (matchedTcTerms.m_a[lVar28] < 1) {
            if (tcTerms.m_a[lVar28] < 1) {
              ON_2fPoint::operator=
                        ((ON_2fPoint *)
                         ((long)&(temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a)->x + lVar35),
                         &ON_3dPoint::Origin);
            }
            else {
              ON_3dPoint::operator/
                        (vtx,(ON_3dPoint *)
                             ((long)&(tcSum.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar34),
                         (double)tcTerms.m_a[lVar28]);
              ON_2fPoint::operator=
                        ((ON_2fPoint *)
                         ((long)&(temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a)->x + lVar35),vtx);
            }
          }
          else {
            ON_3dPoint::operator/
                      (vtx,(ON_3dPoint *)
                           ((long)&(matchedTcSum.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar34),
                       (double)matchedTcTerms.m_a[lVar28]);
            ON_2fPoint::operator=
                      ((ON_2fPoint *)
                       ((long)&(temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a)->x + lVar35),vtx);
          }
          lVar35 = lVar35 + 8;
          lVar34 = lVar34 + 0x18;
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&matchedTcTerms);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&matchedTcSum.super_ON_SimpleArray<ON_3dPoint>);
        ON_SimpleArray<int>::~ON_SimpleArray(&tcTerms);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&tcSum.super_ON_SimpleArray<ON_3dPoint>);
        CMeshClosestPointMapper::~CMeshClosestPointMapper(&meshMapper);
        lVar34 = 0;
        for (lVar28 = 0; lVar28 < temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_count;
            lVar28 = lVar28 + 1) {
          ON_3dPoint::ON_3dPoint
                    ((ON_3dPoint *)&meshMapper,
                     (double)temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a[lVar28].x,
                     (double)temp_tcs.super_ON_SimpleArray<ON_2fPoint>.m_a[lVar28].y,0.0);
          ON_Xform::operator*(vtx,&this->m_uvw,(ON_3dPoint *)&meshMapper);
          meshMapper.m_tc = (ON_2fPointArray *)vtx[0].z;
          meshMapper.m_mesh = (ON_Mesh *)CONCAT44(vtx[0].y._4_4_,vtx[0].y._0_4_);
          meshMapper.super_IClosestPointMapper._vptr_IClosestPointMapper = (_func_int **)vtx[0].x;
          ON_3fPoint::Set((ON_3fPoint *)((long)&T->m_a->x + lVar34),(float)vtx[0].x,
                          (float)(double)meshMapper.m_mesh,(float)vtx[0].z);
          lVar34 = lVar34 + 0xc;
        }
        if (local_cd8 != (int *)0x0) {
          memset(local_cd8,0,newcap * 4);
        }
      }
    }
    ON_SimpleArray<ON_2fPoint>::~ON_SimpleArray(&temp_tcs.super_ON_SimpleArray<ON_2fPoint>);
  }
  else if ((local_ca8 == (ON_3fVector *)0x0) ||
          ((this->m_projection != ray_projection &&
           ((wcsbox_projection < this->m_type || ((0x1068U >> (this->m_type & 0x1f) & 1) == 0))))))
  {
    if (m == (double *)0x0) {
      piVar33 = local_cd8;
      for (lVar34 = 0; newcap * 0xc - lVar34 != 0; lVar34 = lVar34 + 0xc) {
        ON_3dPoint::operator=(&local_c08,(ON_3fPoint *)((long)&pOVar27->x + lVar34));
        iVar26 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                           (this,&local_c08,&local_b78,&tc);
        ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar34),&tc);
        if (local_cd8 != (int *)0x0) {
          *piVar33 = iVar26;
        }
        piVar33 = piVar33 + 1;
      }
    }
    else {
      piVar33 = local_cd8;
      for (lVar34 = 0; newcap * 0xc - lVar34 != 0; lVar34 = lVar34 + 0xc) {
        dVar38 = (double)*(float *)((long)&pOVar27->x + lVar34);
        dVar39 = (double)*(float *)((long)&pOVar27->y + lVar34);
        dVar40 = (double)*(float *)((long)&pOVar27->z + lVar34);
        dVar41 = m[0xe] * dVar40 + m[0xc] * dVar38 + m[0xd] * dVar39 + m[0xf];
        uVar37 = -(ulong)(dVar41 != 0.0);
        local_c08.z = (double)(~uVar37 & 0x3ff0000000000000 | (ulong)(1.0 / dVar41) & uVar37);
        local_c08.x = local_c08.z * (m[3] + dVar40 * m[2] + dVar38 * *m + dVar39 * m[1]);
        local_c08.y = local_c08.z * (m[7] + dVar40 * m[6] + dVar38 * m[4] + dVar39 * m[5]);
        local_c08.z = (dVar40 * m[10] + dVar38 * m[8] + dVar39 * m[9] + m[0xb]) * local_c08.z;
        iVar26 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                           (this,&local_c08,&local_b78,&tc);
        ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar34),&tc);
        if (local_cd8 != (int *)0x0) {
          *piVar33 = iVar26;
        }
        piVar33 = piVar33 + 1;
      }
    }
  }
  else if (m == (double *)0x0 || m_00 == (double *)0x0) {
    piVar33 = local_cd8;
    for (lVar34 = 0; newcap * 0xc - lVar34 != 0; lVar34 = lVar34 + 0xc) {
      ON_3dPoint::operator=(&local_c08,(ON_3fPoint *)((long)&pOVar27->x + lVar34));
      ON_3dVector::operator=(&local_b78,(ON_3fVector *)((long)&local_ca8->x + lVar34));
      iVar26 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                         (this,&local_c08,&local_b78,&tc);
      ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar34),&tc);
      if (local_cd8 != (int *)0x0) {
        *piVar33 = iVar26;
      }
      piVar33 = piVar33 + 1;
    }
  }
  else {
    piVar33 = local_cd8;
    for (lVar34 = 0; newcap * 0xc - lVar34 != 0; lVar34 = lVar34 + 0xc) {
      dVar38 = (double)*(float *)((long)&pOVar27->x + lVar34);
      dVar40 = (double)*(float *)((long)&pOVar27->y + lVar34);
      dVar39 = (double)*(float *)((long)&pOVar27->z + lVar34);
      dVar41 = m[0xe] * dVar39 + m[0xc] * dVar38 + m[0xd] * dVar40 + m[0xf];
      uVar37 = -(ulong)(dVar41 != 0.0);
      local_c08.z = (double)(~uVar37 & 0x3ff0000000000000 | (ulong)(1.0 / dVar41) & uVar37);
      local_c08.x = local_c08.z * (m[3] + dVar39 * m[2] + dVar38 * *m + dVar40 * m[1]);
      local_c08.y = local_c08.z * (m[7] + dVar39 * m[6] + dVar38 * m[4] + dVar40 * m[5]);
      local_c08.z = (dVar39 * m[10] + dVar38 * m[8] + dVar40 * m[9] + m[0xb]) * local_c08.z;
      dVar38 = (double)*(float *)((long)&local_ca8->x + lVar34);
      dVar39 = (double)*(float *)((long)&local_ca8->y + lVar34);
      dVar40 = (double)*(float *)((long)&local_ca8->z + lVar34);
      local_b78.x = dVar40 * m[2] + dVar38 * *m + dVar39 * m[1];
      local_b78.y = dVar40 * m[6] + dVar38 * m[4] + dVar39 * m[5];
      local_b78.z = m[8] * dVar38 + m[9] * dVar39 + m[10] * dVar40;
      ON_3dVector::Unitize(&local_b78);
      iVar26 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                         (this,&local_c08,&local_b78,&tc);
      ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar34),&tc);
      if (local_cd8 != (int *)0x0) {
        *piVar33 = iVar26;
      }
      piVar33 = piVar33 + 1;
    }
  }
  return true;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
          const ON_Mesh& mesh,
          ON_SimpleArray<ON_3fPoint>& T,
          const ON_Xform* mesh_xform,
          bool bLazy,
          ON_SimpleArray<int>* Tside
          ) const
{
  if ( Tside )
    Tside->SetCount(0);

  int i;
  const int vcnt = mesh.m_V.Count();
  if ( vcnt <= 0 )
    return false;

  if ( bLazy )
  {
    int tci, tccount = mesh.m_TC.Count();
    for ( tci = 0; tci < tccount; tci++ )
    {
      if ( vcnt == mesh.m_TC[tci].m_T.Count() )
      {
        if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
        {
          T = mesh.m_TC[tci].m_T;
          return true;
        }
      }
    }

    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      T.Reserve(vcnt);
      T.SetCount(vcnt);
      const ON_2fPoint* f = mesh.m_T.Array();
      ON_3fPoint* d = T.Array();
      for ( i = vcnt; i--; f++, d++ )
      {
        d->x = f->x;
        d->y = f->y;
        d->z = 0.0f;
      }
      return true;
    }
  }

	bool rc = false;

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    // uv textures from surface parameterization
    T.Reserve(vcnt);
    T.SetCount(vcnt);
    T.Zero();
    rc = GetSPTCHelper(mesh,*this,&T[0].x,3);
	}
  else
  {
    ON_3dPoint  P, tc;
		ON_3dVector N(0.0,0.0,0.0);

		const ON_3fPoint*  mesh_V = mesh.m_V.Array();
		const ON_3fVector* mesh_N = mesh.HasVertexNormals()
                              ? mesh.m_N.Array()
                              : 0;

    T.Reserve(vcnt);
    T.SetCount(vcnt);

    int* Tsd = 0;
    if ( Tside )
    {
      Tside->Reserve(vcnt);
      Tside->SetCount(vcnt);
      Tsd = Tside->Array();
      memset(Tsd,0,vcnt*sizeof(Tsd[0]));
    }

    ON_Xform P_xform(ON_Xform::IdentityTransformation), N_xform(ON_Xform::IdentityTransformation);
    const double* PT = 0;
    const double* NT = 0;
    if ( mesh_xform )
    {
      if ( mesh_xform->IsZero() || mesh_xform->IsIdentity() )
      {
        // ignore transformation
        mesh_xform = 0;
      }
      else if ( 0.0 != mesh_xform->GetMappingXforms(P_xform,N_xform) )
      {
        PT = &P_xform[0][0];
        NT = &N_xform[0][0];
      }
      else
      {
        mesh_xform = 0;
      }
    }

    const float* f;
    double w;
    int sd;

		if (ON_TextureMapping::PROJECTION::clspt_projection == m_projection
      && (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type || ON_TextureMapping::TYPE::brep_mapping_primitive == m_type)
      && nullptr != m_mapping_primitive)
		{
      rc = false;
			ON_2fPointArray temp_tcs;

			// Jussi, 11-Nov-2010: Apply mapping primitive transformations first

			ON_Xform matP(m_Pxyz);
			ON_Xform matN(m_Nxyz);

			if (nullptr != PT)
				matP = matP * ON_Xform(PT);

			if (nullptr != NT)
				matN = matN * ON_Xform(NT);

			if (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type)
			{
				const ON_Mesh * pMesh = CustomMappingMeshPrimitive();
				if (nullptr != pMesh)
				{
					CMeshClosestPointMapper meshMapper(*pMesh, pMesh->m_T, mesh.GetRenderMeshInfo(), matP);
					rc = ProjectTextureCoordinates(meshMapper, mesh, temp_tcs, &matP.m_xform[0][0], &matN.m_xform[0][0]);
				}
			}

      if (rc)
			{
				for (int i_local = 0; i_local < temp_tcs.Count(); i_local++)
				{
					// Jussi, 11-Nov-2010: Fix for the problem reported by Michael Fritzsche: Custom mesh mapping does not
					// obey uvw repeat settings. Solution: multiply the 'mapping coordinate' with m_uvw to
					// get the final texture coordinate.

					ON_3dPoint ptT(temp_tcs[i_local].x, temp_tcs[i_local].y, 0.0);
					ptT = m_uvw * ptT;
					T[i_local].Set((float)ptT.x, (float)ptT.y, (float)ptT.z);
				}

				if (nullptr != Tsd)
				{
					memset(Tsd, 0, vcnt * sizeof(int));
				}
			}
		}
		else if ( mesh_N &&
          (   ON_TextureMapping::PROJECTION::ray_projection == m_projection
           || ON_TextureMapping::TYPE::box_mapping == m_type
           || ON_TextureMapping::TYPE::cylinder_mapping == m_type
           || ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type
           || ON_TextureMapping::TYPE::wcsbox_projection == m_type
		   )
        )
  	{
			// calculation uses mesh vertex normal
      if ( PT && NT )
      {
        // need to transform vertex and normal
        // before calculating texture coordinates
			  for (i = 0; i < vcnt; i++)
			  {
          f = &mesh_V[i].x;
				  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
          w = (0.0 != w) ? 1.0/w : 1.0;
				  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
				  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
				  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);

          f = &mesh_N[i].x;
          N.x = PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2];
				  N.y = PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2];
				  N.z = PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2];
          N.Unitize();
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
			else
      {
        // mesh vertex and normal are ok
			  for (i = 0; i < vcnt; i++)
			  {
				  P = mesh_V[i];
				  N = mesh_N[i];
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
		}
		else if ( PT )
    {
      // normal is not used
      // mesh vertex needs to be transformed
      for ( i = 0; i < vcnt; i++ )
      {
        f = &mesh_V[i].x;
			  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
        w = (0.0 != w) ? 1.0/w : 1.0;
			  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
			  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
			  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);
        sd = Evaluate(P,N,&tc);
			  T[i] = tc;
        if ( Tsd )
          Tsd[i] = sd;
		  }
    }
    else
		{
			// normal is not used and mesh vertex is ok
			for ( i = 0; i < vcnt; i++ )
			{
				P = mesh_V[i];
				sd = Evaluate(P,N,&tc);
				T[i] = tc;
				if ( Tsd )
					Tsd[i] = sd;
			}
    }
    rc = true;
	}

	return rc;
}